

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.cpp
# Opt level: O2

Node * __thiscall itis::SplayTree::search(SplayTree *this,int x)

{
  Node *pNVar1;
  Node *pNVar2;
  SplayTree *pSVar3;
  long lVar4;
  
  pNVar2 = (Node *)0x0;
  pSVar3 = this;
  while (pNVar1 = pSVar3->root, pNVar1 != (Node *)0x0) {
    lVar4 = 0x10;
    pNVar2 = pNVar1;
    if ((pNVar1->data <= x) && (lVar4 = 0x18, x <= pNVar1->data)) goto LAB_00103716;
    pSVar3 = (SplayTree *)((long)&pNVar1->data + lVar4);
  }
  if (pNVar2 != (Node *)0x0) {
LAB_00103716:
    splay(this,pNVar2);
  }
  return pNVar1;
}

Assistant:

Node *SplayTree::search(int x) {
    Node *ret = nullptr;
    Node *curr = this->root;
    Node *prev = nullptr;
    while (curr != nullptr) {
      prev = curr;
      if (x < curr->data) {
        curr = curr->left_child;
      } else if (x > curr->data) {
        curr = curr->right_child;
      } else {
        ret = curr;
        break;
      }
    }
    if (ret != nullptr) {
      splay(ret);
    } else if (prev != nullptr) {
      splay(prev);
    }
    return ret;
  }